

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall Assimp::OpenGEX::OpenGEXImporter::OpenGEXImporter(OpenGEXImporter *this)

{
  MetricInfo *local_28;
  OpenGEXImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f41568;
  this->m_root = (ChildInfo *)0x0;
  memset(&this->m_nodeChildMap,0,0x30);
  std::
  map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
  ::map(&this->m_nodeChildMap);
  memset(&this->m_meshCache,0,0x18);
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::vector(&this->m_meshCache);
  memset(&this->m_mesh2refMap,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->m_mesh2refMap);
  memset(&this->m_material2refMap,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->m_material2refMap);
  this->m_ctx = (Context *)0x0;
  local_28 = this->m_metrics;
  do {
    MetricInfo::MetricInfo(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (MetricInfo *)&this->m_currentNode);
  this->m_currentNode = (aiNode *)0x0;
  VertexContainer::VertexContainer(&this->m_currentVertices);
  this->m_currentMesh = (aiMesh *)0x0;
  this->m_currentMaterial = (aiMaterial *)0x0;
  this->m_currentLight = (aiLight *)0x0;
  this->m_currentCamera = (aiCamera *)0x0;
  this->m_tokenType = -1;
  memset(&this->m_materialCache,0,0x18);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector(&this->m_materialCache);
  memset(&this->m_cameraCache,0,0x18);
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::vector(&this->m_cameraCache);
  memset(&this->m_lightCache,0,0x18);
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::vector(&this->m_lightCache);
  memset(&this->m_nodeStack,0,0x18);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector(&this->m_nodeStack);
  memset(&this->m_unresolvedRefStack,0,0x18);
  std::
  vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
  ::vector(&this->m_unresolvedRefStack);
  return;
}

Assistant:

OpenGEXImporter::OpenGEXImporter()
: m_root( nullptr )
, m_nodeChildMap()
, m_meshCache()
, m_mesh2refMap()
, m_material2refMap()
, m_ctx( nullptr )
, m_metrics()
, m_currentNode( nullptr )
, m_currentVertices()
, m_currentMesh( nullptr )
, m_currentMaterial( nullptr )
, m_currentLight( nullptr )
, m_currentCamera( nullptr )
, m_tokenType( Grammar::NoneType )
, m_materialCache()
, m_cameraCache()
, m_lightCache()
, m_nodeStack()
, m_unresolvedRefStack() {
    // empty
}